

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O2

int __thiscall
llvm::DWARFExpression::verify
          (DWARFExpression *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  iterator *__return_storage_ptr__;
  int iVar1;
  ulong siglen_00;
  uchar *extraout_RDX;
  uchar *sig_00;
  uchar *extraout_RDX_00;
  undefined8 unaff_R12;
  Operation *Op;
  undefined1 local_a8 [8];
  iterator __end1;
  iterator __begin1;
  
  __return_storage_ptr__ = (iterator *)(__end1.Op.OperandEndOffsets + 1);
  begin(__return_storage_ptr__,this);
  end((iterator *)local_a8,this);
  sig_00 = extraout_RDX;
  while( true ) {
    siglen_00 = (ulong)__end1.Expr ^ (ulong)__begin1.Expr |
                __end1.Op.OperandEndOffsets[1] ^ (ulong)local_a8;
    unaff_R12 = CONCAT71((int7)((ulong)unaff_R12 >> 8),siglen_00 == 0);
    if (siglen_00 == 0) break;
    iVar1 = Operation::verify((Operation *)&__begin1.Offset,ctx,sig_00,siglen_00,tbs,tbslen);
    if ((char)iVar1 == '\0') break;
    iterator::operator++(__return_storage_ptr__);
    sig_00 = extraout_RDX_00;
  }
  return (int)unaff_R12;
}

Assistant:

bool DWARFExpression::verify(DWARFUnit *U) {
  for (auto &Op : *this)
    if (!Op.verify(U))
      return false;

  return true;
}